

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.h
# Opt level: O1

chain * __thiscall
hashset<hashtableentry<char_*,_int>_>::insert(hashset<hashtableentry<char_*,_int>_> *this,uint h)

{
  chain **ppcVar1;
  chain *pcVar2;
  chainchunk *pcVar3;
  chainchunk *pcVar4;
  long lVar5;
  
  if (this->unused == (chain *)0x0) {
    pcVar4 = (chainchunk *)operator_new(0x608);
    pcVar4->next = this->chunks;
    this->chunks = pcVar4;
    lVar5 = 0x3f;
    pcVar3 = pcVar4;
    do {
      pcVar3->chains[0].next = pcVar3->chains + 1;
      lVar5 = lVar5 + -1;
      pcVar3 = (chainchunk *)(pcVar3->chains + 1);
    } while (lVar5 != 0);
    pcVar4->chains[0x3f].next = (chain *)0x0;
    this->unused = (chain *)pcVar4;
  }
  ppcVar1 = this->chains;
  pcVar2 = this->unused;
  this->unused = pcVar2->next;
  pcVar2->next = ppcVar1[h];
  ppcVar1[h] = pcVar2;
  this->numelems = this->numelems + 1;
  return pcVar2;
}

Assistant:

chain *insert(uint h)
    {
        if(!unused)
        {
            chainchunk *chunk = new chainchunk;
            chunk->next = chunks;
            chunks = chunk;
            loopi(CHUNKSIZE-1) chunk->chains[i].next = &chunk->chains[i+1];
            chunk->chains[CHUNKSIZE-1].next = unused;
            unused = chunk->chains;
        }
        chain *c = unused;
        unused = unused->next;
        c->next = chains[h];
        chains[h] = c;
        numelems++;
        return c;
    }